

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::addAnchor_helper
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *firstItem,AnchorPoint firstEdge,
          QGraphicsLayoutItem *secondItem,AnchorPoint secondEdge,AnchorData *data)

{
  Orientation OVar1;
  QGraphicsAnchorLayout *pQVar2;
  AnchorVertex *v1_00;
  AnchorVertex *v2_00;
  AnchorData *pAVar3;
  long in_RCX;
  AnchorPoint in_EDX;
  long in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  AnchorVertex *unaff_retaddr;
  AnchorVertex *v2;
  AnchorVertex *v1;
  Orientation orientation;
  QGraphicsAnchorLayout *q;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  QGraphicsAnchorLayoutPrivate *item;
  
  item = in_RDI;
  pQVar2 = q_func(in_RDI);
  OVar1 = edgeOrientation(in_EDX);
  v1_00 = addInternalVertex((QGraphicsAnchorLayoutPrivate *)
                            CONCAT44(in_R8D,in_stack_ffffffffffffffd8),(QGraphicsLayoutItem *)item,
                            (AnchorPoint)((ulong)in_RSI >> 0x20));
  v2_00 = addInternalVertex((QGraphicsAnchorLayoutPrivate *)
                            CONCAT44(in_R8D,in_stack_ffffffffffffffd8),(QGraphicsLayoutItem *)item,
                            (AnchorPoint)((ulong)in_RSI >> 0x20));
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
              *)v2_00,(Orientation)((ulong)in_RDI >> 0x20));
  pAVar3 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
                     ((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                       *)v2_00,v2,unaff_retaddr);
  if (pAVar3 != (AnchorData *)0x0) {
    removeAnchor_helper((QGraphicsAnchorLayoutPrivate *)CONCAT44(OVar1,in_stack_ffffffffffffffc0),
                        v1_00,v2_00);
  }
  if (in_RSI == in_RCX) {
    *(long *)(in_R9 + 0x68) = in_RSI;
  }
  *(byte *)(in_R9 + 0x78) = *(byte *)(in_R9 + 0x78) & 0xef | (OVar1 == Vertical) << 4;
  *(AnchorVertex **)(in_R9 + 0x18) = v1_00;
  *(AnchorVertex **)(in_R9 + 0x20) = v2_00;
  *(byte *)(in_R9 + 0x78) =
       *(byte *)(in_R9 + 0x78) & 0xfb | (*(QGraphicsAnchorLayout **)(in_R9 + 0x68) == pQVar2) << 2;
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
              *)v2_00,(Orientation)((ulong)in_RDI >> 0x20));
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::createEdge
            ((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *)
             CONCAT44(OVar1,in_stack_ffffffffffffffc0),v1_00,v2_00,(AnchorData *)in_RDI);
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::addAnchor_helper(QGraphicsLayoutItem *firstItem,
                                                    Qt::AnchorPoint firstEdge,
                                                    QGraphicsLayoutItem *secondItem,
                                                    Qt::AnchorPoint secondEdge,
                                                    AnchorData *data)
{
    Q_Q(QGraphicsAnchorLayout);

    const Qt::Orientation orientation = edgeOrientation(firstEdge);

    // Create or increase the reference count for the related vertices.
    AnchorVertex *v1 = addInternalVertex(firstItem, firstEdge);
    AnchorVertex *v2 = addInternalVertex(secondItem, secondEdge);

    // Remove previous anchor
    if (graph[orientation].edgeData(v1, v2)) {
        removeAnchor_helper(v1, v2);
    }

    // If its an internal anchor, set the associated item
    if (firstItem == secondItem)
        data->item = firstItem;

    data->isVertical = orientation == Qt::Vertical;

    // Create a bi-directional edge in the sense it can be transversed both
    // from v1 or v2. "data" however is shared between the two references
    // so we still know that the anchor direction is from 1 to 2.
    data->from = v1;
    data->to = v2;
#ifdef QT_DEBUG
    data->name = QString::fromLatin1("%1 --to--> %2").arg(v1->toString(), v2->toString());
#endif
    // ### bit to track internal anchors, since inside AnchorData methods
    // we don't have access to the 'q' pointer.
    data->isLayoutAnchor = (data->item == q);

    graph[orientation].createEdge(v1, v2, data);
}